

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv__finish_close(uv_handle_t *handle)

{
  uv_handle_type uVar1;
  uv_handle_t *handle_local;
  
  if ((handle->flags & 1) == 0) {
    __assert_fail("handle->flags & UV_HANDLE_CLOSING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/core.c"
                  ,0xf9,"void uv__finish_close(uv_handle_t *)");
  }
  if ((handle->flags & 2) != 0) {
    __assert_fail("!(handle->flags & UV_HANDLE_CLOSED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/core.c"
                  ,0xfa,"void uv__finish_close(uv_handle_t *)");
  }
  handle->flags = handle->flags | 2;
  uVar1 = handle->type;
  if ((uVar1 - UV_ASYNC < 4) || (uVar1 == UV_IDLE)) goto LAB_00114528;
  if (uVar1 != UV_NAMED_PIPE) {
    if (uVar1 - UV_POLL < 3) goto LAB_00114528;
    if (uVar1 != UV_TCP) {
      if (uVar1 == UV_TIMER) goto LAB_00114528;
      if (uVar1 != UV_TTY) {
        if (uVar1 == UV_UDP) {
          uv__udp_finish_close((uv_udp_t *)handle);
        }
        else if (uVar1 != UV_SIGNAL) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/core.c"
                        ,0x115,"void uv__finish_close(uv_handle_t *)");
        }
        goto LAB_00114528;
      }
    }
  }
  uv__stream_destroy((uv_stream_t *)handle);
LAB_00114528:
  if ((((handle->flags & 8) != 0) &&
      (handle->flags = handle->flags & 0xfffffff7, (handle->flags & 1) == 0)) &&
     ((handle->flags & 4) != 0)) {
    handle->loop->active_handles = handle->loop->active_handles - 1;
  }
  *(void **)handle->handle_queue[1] = handle->handle_queue[0];
  *(void **)((long)handle->handle_queue[0] + 8) = handle->handle_queue[1];
  if (handle->close_cb != (uv_close_cb)0x0) {
    (*handle->close_cb)(handle);
  }
  return;
}

Assistant:

static void uv__finish_close(uv_handle_t* handle) {
  /* Note: while the handle is in the UV_HANDLE_CLOSING state now, it's still
   * possible for it to be active in the sense that uv__is_active() returns
   * true.
   *
   * A good example is when the user calls uv_shutdown(), immediately followed
   * by uv_close(). The handle is considered active at this point because the
   * completion of the shutdown req is still pending.
   */
  assert(handle->flags & UV_HANDLE_CLOSING);
  assert(!(handle->flags & UV_HANDLE_CLOSED));
  handle->flags |= UV_HANDLE_CLOSED;

  switch (handle->type) {
    case UV_PREPARE:
    case UV_CHECK:
    case UV_IDLE:
    case UV_ASYNC:
    case UV_TIMER:
    case UV_PROCESS:
    case UV_FS_EVENT:
    case UV_FS_POLL:
    case UV_POLL:
    case UV_SIGNAL:
      break;

    case UV_NAMED_PIPE:
    case UV_TCP:
    case UV_TTY:
      uv__stream_destroy((uv_stream_t*)handle);
      break;

    case UV_UDP:
      uv__udp_finish_close((uv_udp_t*)handle);
      break;

    default:
      assert(0);
      break;
  }

  uv__handle_unref(handle);
  QUEUE_REMOVE(&handle->handle_queue);

  if (handle->close_cb) {
    handle->close_cb(handle);
  }
}